

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

int sat_solver2_solve(sat_solver2 *s,lit *begin,lit *end,ABC_INT64_T nConfLimit,
                     ABC_INT64_T nInsLimit,ABC_INT64_T nConfLimitGlobal,ABC_INT64_T nInsLimitGlobal)

{
  ABC_INT64_T *pAVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined8 begin_00;
  veci *v;
  int iVar9;
  clause *pcVar10;
  abctime aVar11;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  uint *puVar15;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  int iVar16;
  sat_solver2 *v_00;
  FILE *pFVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  uint k;
  char cVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 local_b0 [20];
  int local_9c;
  ABC_INT64_T *local_98;
  sat_solver2 *local_90;
  veci *local_88;
  long local_80;
  double *local_78;
  uint *local_70;
  Sat_Mem_t *local_68;
  veci *local_60;
  veci *local_58;
  int *local_50;
  long local_48;
  double local_40;
  int local_38 [2];
  
  s->hLearntLast = -1;
  s->hProofLast = -1;
  s->nConfLimit = 0;
  s->nInsLimit = 0;
  if (nConfLimit == 0) {
    lVar14 = 0;
  }
  else {
    lVar14 = nConfLimit + (s->stats).conflicts;
    s->nConfLimit = lVar14;
  }
  if (nInsLimit == 0) {
    lVar19 = 0;
  }
  else {
    lVar19 = nInsLimit + (s->stats).propagations;
    s->nInsLimit = lVar19;
  }
  local_98 = &s->nConfLimit;
  if ((nConfLimitGlobal != 0) && (lVar14 == 0 || nConfLimitGlobal < lVar14)) {
    *local_98 = nConfLimitGlobal;
  }
  if ((nInsLimitGlobal != 0) && (lVar19 == 0 || nInsLimitGlobal < lVar19)) {
    s->nInsLimit = nInsLimitGlobal;
  }
  local_50 = &s->root_level;
  s->root_level = (int)((ulong)((long)end - (long)begin) >> 2);
  v_00 = s;
  while( true ) {
    if (end <= begin) {
      if (s->root_level != (s->trail_lim).size) {
        __assert_fail("s->root_level == solver2_dlevel(s)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x792,
                      "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                     );
      }
      if (0 < s->verbosity) {
        Abc_Print((int)v_00,
                  "==================================[MINISAT]===================================\n"
                 );
        Abc_Print((int)v_00,
                  "| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n"
                 );
        Abc_Print((int)v_00,
                  "|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n"
                 );
        Abc_Print((int)v_00,
                  "==============================================================================\n"
                 );
      }
      local_68 = &s->Mem;
      local_88 = &s->mark_levels;
      local_58 = &s->min_lit_order;
      local_60 = &s->min_step_order;
      local_38 = (int  [2])&s->order;
      local_78 = &s->random_seed;
      cVar21 = '\0';
      local_9c = 0;
      local_90 = s;
      goto LAB_00715104;
    }
    uVar23 = *begin;
    iVar20 = (int)uVar23 >> 1;
    if (s->size <= iVar20) {
      __assert_fail("lit_var(p) < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                    ,0x76a,
                    "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                   );
    }
    veci_push(&s->trail_lim,s->qtail);
    iVar9 = solver2_enqueue(s,uVar23,0);
    if (iVar9 == 0) break;
    v_00 = s;
    pcVar10 = solver2_propagate(s);
    begin = (lit *)((uint *)begin + 1);
    if (pcVar10 != (clause *)0x0) {
      iVar20 = solver2_analyze_final(s,pcVar10,0);
      if ((s->conf_final).size < 1) {
        __assert_fail("s->conf_final.size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x78b,
                      "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                     );
      }
      s->hProofLast = iVar20;
LAB_00715a3f:
      solver2_canceluntil(s,0);
      return -1;
    }
  }
  pcVar10 = Sat_MemClauseHand(&s->Mem,s->reasons[iVar20]);
  if (pcVar10 == (clause *)0x0) {
    veci_resize(&s->conf_final,0);
    veci_push(&s->conf_final,uVar23 ^ 1);
    iVar9 = -1;
    if (0 < s->levels[iVar20]) goto LAB_00715a33;
  }
  else {
    iVar9 = solver2_analyze_final(s,pcVar10,1);
    uVar23 = uVar23 ^ 1;
LAB_00715a33:
    veci_push(&s->conf_final,uVar23);
  }
  s->hProofLast = iVar9;
  goto LAB_00715a3f;
LAB_00715104:
  iVar20 = (int)v_00;
  if (cVar21 == '\0') {
    if (0 < s->verbosity) {
      uVar23 = (s->stats).learnts;
      dVar26 = (double)uVar23;
      dVar27 = (double)(s->stats).learnts_literals;
      dVar28 = 0.0;
      if (uVar23 != 0) {
        dVar28 = dVar27 / dVar26;
      }
      Abc_Print(iVar20,"| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
                (double)(s->stats).conflicts,(double)(s->stats).clauses,
                (double)(s->stats).clauses_literals,(double)s->nLearntMax,dVar26,dVar27,dVar28,
                s->progress_estimate * 100.0);
      pFVar17 = _stdout;
      fflush(_stdout);
      iVar20 = (int)pFVar17;
    }
    if ((s->nRuntimeLimit == 0) || (aVar11 = Abc_Clock(), aVar11 <= s->nRuntimeLimit)) {
      if ((s->nLearntMax != 0) &&
         ((s->nLearntMax <= (s->act_clas).size && (s->pPrf2 == (Prf_Man_t *)0x0)))) {
        sat_solver2_reducedb(s);
      }
      dVar26 = luby2(2.0,local_9c);
      if (s->root_level != (s->trail_lim).size) {
        __assert_fail("s->root_level == solver2_dlevel(s)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x3f2,"lbool solver2_search(sat_solver2 *, ABC_INT64_T)");
      }
      iVar20 = s->fNotUseRandom;
      (s->stats).starts = (s->stats).starts + 1;
      local_b0._0_4_ = 4;
      local_b0._4_4_ = 0;
      local_b0._8_8_ = malloc(0x10);
      local_70 = (uint *)0x3f947ae140000000;
      if (iVar20 != 0) {
        local_70 = (uint *)0x0;
      }
      local_9c = local_9c + 1;
      local_48 = (long)(dVar26 * 100.0);
      local_80 = 0;
      s = local_90;
      do {
        bVar25 = -1 < local_48;
        bVar6 = local_48 <= local_80;
        while (pcVar10 = solver2_propagate(s), pcVar10 == (clause *)0x0) {
          if (((bVar6 && bVar25) ||
              ((((s->nRuntimeLimit != 0 && (((s->stats).conflicts & 0x3f) == 0)) &&
                (aVar11 = Abc_Clock(), s->nRuntimeLimit < aVar11)) ||
               ((*local_98 != 0 && (*local_98 < (s->stats).conflicts)))))) ||
             ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) {
            dVar26 = solver2_progress(s);
            s->progress_estimate = dVar26;
            solver2_canceluntil(s,s->root_level);
            cVar21 = '\0';
            goto LAB_0071592a;
          }
          pAVar1 = &(s->stats).decisions;
          *pAVar1 = *pAVar1 + 1;
          piVar13 = s->orderpos;
          puVar15 = (uint *)(s->order).ptr;
          dVar26 = drand(local_78);
          if ((double)local_70 <= dVar26) {
LAB_0071533a:
            do {
              iVar20 = (s->order).size;
              if (iVar20 < 1) goto LAB_007158e4;
              uVar23 = *puVar15;
              k = iVar20 - 1;
              uVar2 = puVar15[k];
              veci_resize((veci *)local_38,k);
              uVar12 = (ulong)(int)uVar23;
              piVar13[uVar12] = -1;
              if (iVar20 != 1) {
                puVar5 = local_90->activity;
                uVar3 = puVar5[(int)uVar2];
                iVar20 = 1;
                iVar9 = 0;
                while (iVar20 < (int)k) {
                  iVar16 = iVar20 + 1;
                  if (((int)k <= iVar16) ||
                     (puVar5[(int)puVar15[iVar16]] <= puVar5[(int)puVar15[iVar20]])) {
                    iVar16 = iVar20;
                  }
                  uVar4 = puVar15[iVar16];
                  if (puVar5[(int)uVar4] <= uVar3) break;
                  puVar15[iVar9] = uVar4;
                  piVar13[(int)uVar4] = iVar9;
                  iVar9 = iVar16;
                  iVar20 = iVar16 * 2 + 1;
                }
                puVar15[iVar9] = uVar2;
                piVar13[(int)uVar2] = iVar9;
              }
              s = local_90;
            } while (local_90->assigns[uVar12] != '\x03');
            if (uVar23 != 0xffffffff) goto LAB_00715408;
LAB_007158e4:
            for (lVar14 = 0; lVar14 < s->size; lVar14 = lVar14 + 1) {
              if (s->assigns[lVar14] == '\x03') {
                __assert_fail("var_value(s,i) != varX",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                              ,0x440,"lbool solver2_search(sat_solver2 *, ABC_INT64_T)");
              }
              s->model[lVar14] = -(uint)(s->assigns[lVar14] != '\0') | 1;
            }
            solver2_canceluntil(s,s->root_level);
            cVar21 = '\x01';
            goto LAB_0071592a;
          }
          local_40 = (double)s->size;
          dVar26 = drand(local_78);
          uVar23 = (uint)(dVar26 * local_40);
          if (((int)uVar23 < 0) || (s->size <= (int)uVar23)) {
            __assert_fail("next >= 0 && next < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                          ,0x10f,"int order_select(sat_solver2 *, float)");
          }
          uVar12 = (ulong)uVar23;
          if (s->assigns[uVar12] != '\x03') goto LAB_0071533a;
LAB_00715408:
          uVar23 = uVar23 * 2;
          if (((uint)s->vi[uVar12] & 1) == 0) {
            uVar23 = uVar23 | 1;
          }
          solver2_assume(s,uVar23);
        }
        pAVar1 = &(s->stats).conflicts;
        *pAVar1 = *pAVar1 + 1;
        if ((s->trail_lim).size <= s->root_level) goto LAB_0071598d;
        veci_resize((veci *)local_b0,0);
        if ((s->tagged).size != 0) {
          __assert_fail("veci_size(&s->tagged) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                        ,0x313,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
        }
        local_80 = local_80 + 1;
        iVar9 = s->qtail + -1;
        proof_chain_start(s,pcVar10);
        veci_push((veci *)local_b0,-2);
        uVar23 = 0;
        iVar20 = 0;
        lVar14 = extraout_RDX;
        while( true ) {
          if (pcVar10 == (clause *)0x0) {
            __assert_fail("c != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                          ,0x31b,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
          }
          if (((uint)*pcVar10 & 1) != 0) {
            act_clause2_bump(s,pcVar10);
            lVar14 = extraout_RDX_00;
          }
          for (uVar12 = (ulong)(0 < (int)uVar23);
              (uVar12 < (uint)*pcVar10 >> 0xb && (1 < (uint)pcVar10[uVar12 + 1]));
              uVar12 = uVar12 + 1) {
            uVar23 = (int)pcVar10[uVar12 + 1] >> 1;
            if (((int)uVar23 < 0) || (s->size <= (int)uVar23)) {
              __assert_fail("x >= 0 && x < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                            ,799,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
            }
            if (((uint)s->vi[uVar23] & 0x3c) == 0) {
              if (s->levels[uVar23] == 0) {
                proof_chain_resolve(s,(clause *)0x0,uVar23);
                lVar14 = extraout_RDX_02;
              }
              else {
                var_set_tag(s,uVar23,(int)lVar14);
                puVar5 = s->activity;
                puVar15 = puVar5 + uVar23;
                *puVar15 = *puVar15 + s->var_inc;
                lVar14 = extraout_RDX_01;
                if ((int)*puVar15 < 0) {
                  for (lVar19 = 0; lVar14 = (long)s->size, lVar19 < lVar14; lVar19 = lVar19 + 1) {
                    puVar15 = puVar5 + lVar19;
                    *puVar15 = *puVar15 >> 0x13;
                  }
                  iVar16 = s->var_inc >> 0x13;
                  if (iVar16 < 0x11) {
                    iVar16 = 0x10;
                  }
                  s->var_inc = iVar16;
                }
                if (s->orderpos[uVar23] != -1) {
                  order_update(s,uVar23);
                  lVar14 = extraout_RDX_03;
                }
                if (s->levels[uVar23] == (s->trail_lim).size) {
                  iVar20 = iVar20 + 1;
                }
                else {
                  veci_push((veci *)local_b0,(int)pcVar10[uVar12 + 1]);
                  lVar14 = extraout_RDX_04;
                }
              }
            }
          }
          puVar15 = (uint *)(s->trail + iVar9);
          do {
            uVar23 = *puVar15;
            iVar16 = (int)uVar23 >> 1;
            puVar15 = puVar15 + -1;
            iVar9 = iVar9 + -1;
          } while (((uint)s->vi[iVar16] & 0x3c) == 0);
          pcVar10 = Sat_MemClauseHand(local_68,s->reasons[iVar16]);
          v = local_88;
          uVar8 = local_b0._8_8_;
          iVar20 = iVar20 + -1;
          if (iVar20 == 0) break;
          proof_chain_resolve(s,pcVar10,iVar16);
          lVar14 = extraout_RDX_05;
        }
        *(uint *)local_b0._8_8_ = uVar23 ^ 1;
        if ((s->mark_levels).size != 0) {
          __assert_fail("veci_size(&s->mark_levels) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                        ,0x33b,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
        }
        lVar19 = (long)(int)local_b0._4_4_;
        for (lVar14 = 1; lVar14 < lVar19; lVar14 = lVar14 + 1) {
          iVar20 = s->levels[(int)*(uint *)(uVar8 + lVar14 * 4) >> 1];
          if ((s->trail_lim).size <= iVar20) {
            __assert_fail("level < veci_size(&s->trail_lim)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                          ,0x83,"void var_lev_set_mark(sat_solver2 *, int)");
          }
          puVar15 = (uint *)((s->trail_lim).ptr + iVar20);
          *puVar15 = *puVar15 | 0x80000000;
          veci_push(v,iVar20);
        }
        veci_resize(local_58,0);
        iVar20 = 1;
        for (lVar14 = 1; lVar24 = (long)iVar20, lVar14 < lVar19; lVar14 = lVar14 + 1) {
          iVar9 = solver2_lit_removable_rec(s,(int)*(uint *)(uVar8 + lVar14 * 4) >> 1);
          if (iVar9 == 0) {
            iVar20 = iVar20 + 1;
            *(uint *)(uVar8 + lVar24 * 4) = *(uint *)(uVar8 + lVar14 * 4);
          }
        }
        if (s->fProofLogging == 0) {
          iVar9 = 0;
        }
        else {
          veci_resize(local_60,0);
          piVar13 = (s->min_lit_order).ptr;
          for (lVar14 = 0; lVar14 < (s->min_lit_order).size; lVar14 = lVar14 + 1) {
            solver2_logging_order_rec(s,piVar13[lVar14]);
          }
          piVar13 = (s->min_step_order).ptr;
          uVar12 = (ulong)(uint)(s->min_step_order).size;
          while (0 < (int)uVar12) {
            uVar18 = uVar12 - 1;
            pcVar10 = Sat_MemClauseHand(local_68,s->reasons[piVar13[uVar12 - 1]]);
            proof_chain_resolve(s,pcVar10,piVar13[uVar12 - 1]);
            for (uVar22 = 1;
                (uVar12 = uVar18, uVar22 < (uint)*pcVar10 >> 0xb &&
                (iVar9 = (int)pcVar10[uVar22 + 1] >> 1, 1 < (uint)pcVar10[uVar22 + 1]));
                uVar22 = uVar22 + 1) {
              if (s->levels[iVar9] == 0) {
                proof_chain_resolve(s,(clause *)0x0,iVar9);
              }
            }
          }
          iVar9 = proof_chain_stop(s);
        }
        piVar13 = (s->mark_levels).ptr;
        for (lVar14 = 0; lVar14 < (s->mark_levels).size; lVar14 = lVar14 + 1) {
          puVar15 = (uint *)((s->trail_lim).ptr + piVar13[lVar14]);
          *puVar15 = *puVar15 & 0x7fffffff;
        }
        veci_resize(local_88,0);
        veci_resize((veci *)local_b0,iVar20);
        pAVar1 = &(s->stats).tot_literals;
        *pAVar1 = *pAVar1 + lVar24;
        solver2_clear_tags(s,iVar20);
        begin_00 = local_b0._8_8_;
        uVar7 = local_b0._4_4_;
        uVar12 = (ulong)(int)local_b0._4_4_;
        piVar13 = local_50;
        if (1 < (long)uVar12) {
          uVar23 = *(uint *)(uVar8 + 4);
          piVar13 = s->levels;
          iVar20 = piVar13[(int)uVar23 >> 1];
          uVar22 = 1;
          for (uVar18 = 2; uVar12 != uVar18; uVar18 = uVar18 + 1) {
            iVar16 = piVar13[(int)*(uint *)(uVar8 + uVar18 * 4) >> 1];
            if (iVar20 < iVar16) {
              uVar22 = uVar18;
            }
            uVar22 = uVar22 & 0xffffffff;
            if (iVar20 <= iVar16) {
              iVar20 = iVar16;
            }
          }
          *(uint *)(uVar8 + 4) = *(uint *)(uVar8 + (long)(int)uVar22 * 4);
          *(uint *)(uVar8 + (long)(int)uVar22 * 4) = uVar23;
          piVar13 = piVar13 + ((int)*(uint *)(local_b0._8_8_ + 4) >> 1);
        }
        iVar20 = *piVar13;
        if (*piVar13 < s->root_level) {
          iVar20 = s->root_level;
        }
        solver2_canceluntil(s,iVar20);
        iVar20 = clause2_create_new(s,(lit *)begin_00,(lit *)(begin_00 + uVar12 * 4),1,iVar9);
        if ((int)uVar7 < 1) {
          __assert_fail("veci_size(cls) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                        ,0x221,"void solver2_record(sat_solver2 *, veci *, int)");
        }
        if (uVar7 == 1) {
          if (s->fProofLogging != 0) {
            var_set_unit_clause(s,(int)*(uint *)begin_00 >> 1,iVar20);
          }
          solver2_enqueue(s,*(uint *)begin_00,0);
          s->levels[(int)*(uint *)begin_00 >> 1] = 0;
        }
        else {
          solver2_enqueue(s,*(uint *)begin_00,iVar20);
        }
        s->var_inc = (s->var_inc >> 4) + s->var_inc;
        s->cla_inc = (s->cla_inc >> 10) + s->cla_inc;
      } while( true );
    }
    cVar21 = '\0';
  }
  goto LAB_00715a51;
LAB_0071598d:
  iVar20 = solver2_analyze_final(s,pcVar10,0);
  if (iVar20 < 1 && s->pPrf1 != (Vec_Set_t *)0x0) {
    __assert_fail("proof_id > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x406,"lbool solver2_search(sat_solver2 *, ABC_INT64_T)");
  }
  s->hProofLast = iVar20;
  cVar21 = -1;
LAB_0071592a:
  v_00 = (sat_solver2 *)local_b0;
  veci_delete((veci *)v_00);
  iVar20 = (int)v_00;
  if (((*local_98 != 0) && (*local_98 < (s->stats).conflicts)) ||
     ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) goto LAB_00715a51;
  goto LAB_00715104;
LAB_00715a51:
  if (0 < s->verbosity) {
    Abc_Print(iVar20,
              "==============================================================================\n");
  }
  solver2_canceluntil(s,0);
  return (int)cVar21;
}

Assistant:

int sat_solver2_solve(sat_solver2* s, lit* begin, lit* end, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, ABC_INT64_T nConfLimitGlobal, ABC_INT64_T nInsLimitGlobal)
{
    int restart_iter = 0;
    ABC_INT64_T  nof_conflicts;
    lbool status = l_Undef;
    int proof_id;
    lit * i;

    s->hLearntLast = -1;
    s->hProofLast = -1;

    // set the external limits
//    s->nCalls++;
//    s->nRestarts  = 0;
    s->nConfLimit = 0;
    s->nInsLimit  = 0;
    if ( nConfLimit )
        s->nConfLimit = s->stats.conflicts + nConfLimit;
    if ( nInsLimit )
//        s->nInsLimit = s->stats.inspects + nInsLimit;
        s->nInsLimit = s->stats.propagations + nInsLimit;
    if ( nConfLimitGlobal && (s->nConfLimit == 0 || s->nConfLimit > nConfLimitGlobal) )
        s->nConfLimit = nConfLimitGlobal;
    if ( nInsLimitGlobal && (s->nInsLimit == 0 || s->nInsLimit > nInsLimitGlobal) )
        s->nInsLimit = nInsLimitGlobal;

/*
    // Perform assumptions:
    root_level = assumps.size();
    for (int i = 0; i < assumps.size(); i++){
        Lit p = assumps[i];
        assert(var(p) < nVars());
        if (!solver2_assume(p)){
            GClause r = reason[var(p)];
            if (r != Gclause2_NULL){
                clause* confl;
                if (r.isLit()){
                    confl = propagate_tmpbin;
                    (*confl)[1] = ~p;
                    (*confl)[0] = r.lit();
                }else
                    confl = r.clause();
                analyzeFinal(confl, true);
                conflict.push(~p);
            }else
                conflict.clear(),
                conflict.push(~p);
            cancelUntil(0);
            return false; }
        clause* confl = propagate();
        if (confl != NULL){
            analyzeFinal(confl), assert(conflict.size() > 0);
            cancelUntil(0);
            return false; }
    }
    assert(root_level == decisionLevel());
*/

    // Perform assumptions:
    s->root_level = end - begin;
    for ( i = begin; i < end; i++ )
    {
        lit p = *i;
        assert(lit_var(p) < s->size);
        veci_push(&s->trail_lim,s->qtail);
        if (!solver2_enqueue(s,p,0))
        {
            clause* r = clause2_read(s, lit_reason(s,p));
            if (r != NULL)
            {
                clause* confl = r;
                proof_id = solver2_analyze_final(s, confl, 1);
                veci_push(&s->conf_final, lit_neg(p));
            }
            else
            {
//                assert( 0 );
//                r = var_unit_clause( s, lit_var(p) );
//                assert( r != NULL );
//                proof_id = clause2_proofid(s, r, 0);
                proof_id = -1; // the only case when ProofId is not assigned (conflicting assumptions)
                veci_resize(&s->conf_final,0);
                veci_push(&s->conf_final, lit_neg(p));
                // the two lines below are a bug fix by Siert Wieringa 
                if (var_level(s, lit_var(p)) > 0)
                    veci_push(&s->conf_final, p);
            }
            s->hProofLast = proof_id;
            solver2_canceluntil(s, 0);
            return l_False;
        }
        else
        {
            clause* confl = solver2_propagate(s);
            if (confl != NULL){
                proof_id = solver2_analyze_final(s, confl, 0);
                assert(s->conf_final.size > 0);
                s->hProofLast = proof_id;
                solver2_canceluntil(s, 0);
                return l_False;
            }
        }
    }
    assert(s->root_level == solver2_dlevel(s));

    if (s->verbosity >= 1){
        Abc_Print(1,"==================================[MINISAT]===================================\n");
        Abc_Print(1,"| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
        Abc_Print(1,"|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
        Abc_Print(1,"==============================================================================\n");
    }

    while (status == l_Undef){
        if (s->verbosity >= 1)
        {
            Abc_Print(1,"| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
                (double)s->stats.conflicts,
                (double)s->stats.clauses,
                (double)s->stats.clauses_literals,
                (double)s->nLearntMax,
                (double)s->stats.learnts,
                (double)s->stats.learnts_literals,
                (s->stats.learnts == 0)? 0.0 : (double)s->stats.learnts_literals / s->stats.learnts,
                s->progress_estimate*100);
            fflush(stdout);
        }
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        // reduce the set of learnt clauses
        if ( s->nLearntMax && veci_size(&s->act_clas) >= s->nLearntMax && s->pPrf2 == NULL )
            sat_solver2_reducedb(s);
        // perform next run
        nof_conflicts = (ABC_INT64_T)( 100 * luby2(2, restart_iter++) );
        status = solver2_search(s, nof_conflicts);
        // quit the loop if reached an external limit
        if ( s->nConfLimit && s->stats.conflicts > s->nConfLimit )
            break;
        if ( s->nInsLimit  && s->stats.propagations > s->nInsLimit )
            break;
    }
    if (s->verbosity >= 1)
        Abc_Print(1,"==============================================================================\n");

    solver2_canceluntil(s,0);
//    assert( s->qhead == s->qtail );
//    if ( status == l_True )
//        sat_solver2_verify( s );
    return status;
}